

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lower_shared_reference.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_6e3e3::lower_shared_reference_visitor::insert_buffer_access
          (lower_shared_reference_visitor *this,void *mem_ctx,ir_dereference *deref,glsl_type *type,
          ir_rvalue *offset,uint mask,int param_6)

{
  ir_instruction *piVar1;
  int iVar2;
  ir_variable *piVar3;
  ir_function_signature *piVar4;
  ir_function *piVar5;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ir_constant *this_00;
  ir_call *piVar7;
  ir_dereference_variable *piVar8;
  exec_node *peVar9;
  operand rhs;
  deref lhs;
  ir_assignment *piVar10;
  exec_list sig_params;
  exec_list local_78;
  exec_list local_58;
  exec_node *peVar6;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  
  if (*(int *)&(this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
               super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.field_0x34 == 1) {
    peVar6 = &local_58.tail_sentinel;
    local_58.head_sentinel.prev = (exec_node *)0x0;
    local_58.tail_sentinel.next = (exec_node *)0x0;
    local_58.head_sentinel.next = peVar6;
    local_58.tail_sentinel.prev = &local_58.head_sentinel;
    piVar3 = (ir_variable *)exec_node::operator_new(0x90,mem_ctx);
    ir_variable::ir_variable(piVar3,&glsl_type::_uint_type,"offset",ir_var_function_in);
    peVar9 = &(piVar3->super_ir_instruction).super_exec_node;
    (piVar3->super_ir_instruction).super_exec_node.next = peVar6;
    (piVar3->super_ir_instruction).super_exec_node.prev = local_58.tail_sentinel.prev;
    ((exec_node *)&(local_58.tail_sentinel.prev)->next)->next = peVar9;
    local_58.tail_sentinel.prev = peVar9;
    piVar3 = (ir_variable *)exec_node::operator_new(0x90,mem_ctx);
    ir_variable::ir_variable(piVar3,(deref->super_ir_rvalue).type,"value",ir_var_function_in);
    peVar9 = &(piVar3->super_ir_instruction).super_exec_node;
    (piVar3->super_ir_instruction).super_exec_node.next = peVar6;
    (piVar3->super_ir_instruction).super_exec_node.prev = local_58.tail_sentinel.prev;
    (local_58.tail_sentinel.prev)->next = peVar9;
    local_58.tail_sentinel.prev = peVar9;
    piVar3 = (ir_variable *)exec_node::operator_new(0x90,mem_ctx);
    ir_variable::ir_variable(piVar3,&glsl_type::_uint_type,"write_mask",ir_var_function_in);
    peVar9 = &(piVar3->super_ir_instruction).super_exec_node;
    (piVar3->super_ir_instruction).super_exec_node.next = peVar6;
    (piVar3->super_ir_instruction).super_exec_node.prev = local_58.tail_sentinel.prev;
    (local_58.tail_sentinel.prev)->next = peVar9;
    local_58.tail_sentinel.prev = peVar9;
    piVar4 = (ir_function_signature *)exec_node::operator_new(0x88,mem_ctx);
    ir_function_signature::ir_function_signature
              (piVar4,&glsl_type::_void_type,compute_shader_enabled);
    ir_function_signature::replace_parameters(piVar4,&local_58);
    piVar4->intrinsic_id = ir_intrinsic_shared_store;
    piVar5 = (ir_function *)exec_node::operator_new(0x60,mem_ctx);
    ir_function::ir_function(piVar5,"__intrinsic_store_shared");
    piVar4->_function = piVar5;
    peVar9 = &(piVar4->super_ir_instruction).super_exec_node;
    (piVar4->super_ir_instruction).super_exec_node.next = &(piVar5->signatures).tail_sentinel;
    peVar6 = (piVar5->signatures).tail_sentinel.prev;
    (piVar4->super_ir_instruction).super_exec_node.prev = peVar6;
    peVar6->next = peVar9;
    (piVar5->signatures).tail_sentinel.prev = peVar9;
    peVar9 = &local_78.tail_sentinel;
    local_78.head_sentinel.prev = (exec_node *)0x0;
    local_78.tail_sentinel.next = (exec_node *)0x0;
    local_78.head_sentinel.next = peVar9;
    local_78.tail_sentinel.prev = &local_78.head_sentinel;
    iVar2 = (*(offset->super_ir_instruction)._vptr_ir_instruction[4])(offset,mem_ctx,0);
    peVar6 = (exec_node *)CONCAT44(extraout_var,iVar2);
    if (peVar6 != (exec_node *)0x0) {
      peVar6 = (exec_node *)&peVar6->prev;
    }
    peVar6->next = peVar9;
    peVar6->prev = local_78.tail_sentinel.prev;
    ((exec_node *)&(local_78.tail_sentinel.prev)->next)->next = peVar6;
    local_78.tail_sentinel.prev = peVar6;
    iVar2 = (*(deref->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[4])
                      (deref,mem_ctx,0);
    peVar6 = (exec_node *)(CONCAT44(extraout_var_00,iVar2) + 8);
    if (CONCAT44(extraout_var_00,iVar2) == 0) {
      peVar6 = (exec_node *)0x0;
    }
    peVar6->next = peVar9;
    peVar6->prev = local_78.tail_sentinel.prev;
    (local_78.tail_sentinel.prev)->next = peVar6;
    local_78.tail_sentinel.prev = peVar6;
    this_00 = (ir_constant *)exec_node::operator_new(0xb0,mem_ctx);
    ir_constant::ir_constant(this_00,mask,1);
    peVar6 = &(this_00->super_ir_rvalue).super_ir_instruction.super_exec_node;
    (this_00->super_ir_rvalue).super_ir_instruction.super_exec_node.next = peVar9;
    (this_00->super_ir_rvalue).super_ir_instruction.super_exec_node.prev =
         local_78.tail_sentinel.prev;
    (local_78.tail_sentinel.prev)->next = peVar6;
    local_78.tail_sentinel.prev = peVar6;
    piVar7 = (ir_call *)exec_node::operator_new(0x60,mem_ctx);
    ir_call::ir_call(piVar7,piVar4,(ir_dereference_variable *)0x0,&local_78);
    piVar1 = (this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
             super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.base_ir;
    peVar9 = &(piVar7->super_ir_instruction).super_exec_node;
    (piVar7->super_ir_instruction).super_exec_node.next = (piVar1->super_exec_node).next;
    (piVar7->super_ir_instruction).super_exec_node.prev = &piVar1->super_exec_node;
    ((piVar1->super_exec_node).next)->prev = peVar9;
    (piVar1->super_exec_node).next = peVar9;
  }
  else {
    local_58.head_sentinel.prev = (exec_node *)0x0;
    local_58.tail_sentinel.next = (exec_node *)0x0;
    local_58.head_sentinel.next = &local_58.tail_sentinel;
    local_58.tail_sentinel.prev = &local_58.head_sentinel;
    piVar3 = (ir_variable *)exec_node::operator_new(0x90,mem_ctx);
    ir_variable::ir_variable(piVar3,&glsl_type::_uint_type,"offset_ref",ir_var_function_in);
    peVar9 = &(piVar3->super_ir_instruction).super_exec_node;
    (piVar3->super_ir_instruction).super_exec_node.next = &local_58.tail_sentinel;
    (piVar3->super_ir_instruction).super_exec_node.prev = local_58.tail_sentinel.prev;
    ((exec_node *)&(local_58.tail_sentinel.prev)->next)->next = peVar9;
    local_58.tail_sentinel.prev = peVar9;
    piVar4 = (ir_function_signature *)exec_node::operator_new(0x88,mem_ctx);
    ir_function_signature::ir_function_signature(piVar4,type,compute_shader_enabled);
    ir_function_signature::replace_parameters(piVar4,&local_58);
    piVar4->intrinsic_id = ir_intrinsic_shared_load;
    piVar5 = (ir_function *)exec_node::operator_new(0x60,mem_ctx);
    ir_function::ir_function(piVar5,"__intrinsic_load_shared");
    piVar4->_function = piVar5;
    peVar9 = &(piVar4->super_ir_instruction).super_exec_node;
    (piVar4->super_ir_instruction).super_exec_node.next = &(piVar5->signatures).tail_sentinel;
    peVar6 = (piVar5->signatures).tail_sentinel.prev;
    (piVar4->super_ir_instruction).super_exec_node.prev = peVar6;
    peVar6->next = peVar9;
    (piVar5->signatures).tail_sentinel.prev = peVar9;
    piVar3 = (ir_variable *)exec_node::operator_new(0x90,mem_ctx);
    ir_variable::ir_variable(piVar3,type,"shared_load_result",ir_var_temporary);
    piVar1 = (this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
             super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.base_ir;
    peVar9 = &(piVar3->super_ir_instruction).super_exec_node;
    (piVar3->super_ir_instruction).super_exec_node.next = &piVar1->super_exec_node;
    (piVar3->super_ir_instruction).super_exec_node.prev = (piVar1->super_exec_node).prev;
    ((piVar1->super_exec_node).prev)->next = peVar9;
    (piVar1->super_exec_node).prev = peVar9;
    piVar8 = (ir_dereference_variable *)exec_node::operator_new(0x30,mem_ctx);
    ir_dereference_variable::ir_dereference_variable(piVar8,piVar3);
    local_78.head_sentinel.prev = (exec_node *)0x0;
    local_78.tail_sentinel.next = (exec_node *)0x0;
    local_78.head_sentinel.next = &local_78.tail_sentinel;
    local_78.tail_sentinel.prev = &local_78.head_sentinel;
    iVar2 = (*(offset->super_ir_instruction)._vptr_ir_instruction[4])(offset,mem_ctx,0);
    peVar9 = (exec_node *)CONCAT44(extraout_var_01,iVar2);
    if (peVar9 != (exec_node *)0x0) {
      peVar9 = (exec_node *)&peVar9->prev;
    }
    peVar9->next = &local_78.tail_sentinel;
    peVar9->prev = local_78.tail_sentinel.prev;
    ((exec_node *)&(local_78.tail_sentinel.prev)->next)->next = peVar9;
    local_78.tail_sentinel.prev = peVar9;
    piVar7 = (ir_call *)exec_node::operator_new(0x60,mem_ctx);
    ir_call::ir_call(piVar7,piVar4,piVar8,&local_78);
    piVar1 = (this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
             super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.base_ir;
    peVar9 = &(piVar7->super_ir_instruction).super_exec_node;
    (piVar7->super_ir_instruction).super_exec_node.next = &piVar1->super_exec_node;
    (piVar7->super_ir_instruction).super_exec_node.prev = (piVar1->super_exec_node).prev;
    ((piVar1->super_exec_node).prev)->next = peVar9;
    (piVar1->super_exec_node).prev = peVar9;
    piVar8 = piVar7->return_deref;
    if (ir_type_texture <
        (piVar8->super_ir_dereference).super_ir_rvalue.super_ir_instruction.ir_type) {
      piVar8 = (ir_dereference_variable *)0x0;
    }
    rhs.val._0_4_ =
         (*(piVar8->super_ir_dereference).super_ir_rvalue.super_ir_instruction._vptr_ir_instruction
           [4])(piVar8,mem_ctx,0);
    rhs.val._4_4_ = extraout_var_02;
    piVar1 = (this->super_lower_buffer_access).super_ir_rvalue_enter_visitor.
             super_ir_rvalue_base_visitor.super_ir_hierarchical_visitor.base_ir;
    lhs.val._0_4_ =
         (*(deref->super_ir_rvalue).super_ir_instruction._vptr_ir_instruction[4])(deref,mem_ctx,0);
    lhs.val._4_4_ = extraout_var_03;
    piVar10 = ir_builder::assign(lhs,rhs);
    if (piVar10 != (ir_assignment *)0x0) {
      piVar10 = (ir_assignment *)&(piVar10->super_ir_instruction).super_exec_node;
    }
    (piVar10->super_ir_instruction)._vptr_ir_instruction = (_func_int **)&piVar1->super_exec_node;
    (piVar10->super_ir_instruction).super_exec_node.next = (piVar1->super_exec_node).prev;
    ((piVar1->super_exec_node).prev)->next = (exec_node *)piVar10;
    (piVar1->super_exec_node).prev = (exec_node *)piVar10;
  }
  return;
}

Assistant:

void
lower_shared_reference_visitor::insert_buffer_access(void *mem_ctx,
                                                     ir_dereference *deref,
                                                     const glsl_type *type,
                                                     ir_rvalue *offset,
                                                     unsigned mask,
                                                     int /* channel */)
{
   if (buffer_access_type == shared_store_access) {
      ir_call *store = shared_store(mem_ctx, deref, offset, mask);
      base_ir->insert_after(store);
   } else {
      ir_call *load = shared_load(mem_ctx, type, offset);
      base_ir->insert_before(load);
      ir_rvalue *value = load->return_deref->as_rvalue()->clone(mem_ctx, NULL);
      base_ir->insert_before(assign(deref->clone(mem_ctx, NULL),
                                    value));
   }
}